

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O3

bool inipp::extract<char,short>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,short *dst)

{
  uint *puVar1;
  long *plVar2;
  istream *piVar3;
  bool bVar4;
  short result;
  char c;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> is;
  short local_194;
  char local_191;
  long local_190 [3];
  uint auStack_178 [24];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)value,_S_in);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  plVar2 = (long *)std::istream::operator>>((istream *)local_190,&local_194);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    piVar3 = std::operator>>((istream *)local_190,&local_191);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      *dst = local_194;
      bVar4 = true;
      goto LAB_0010c93a;
    }
  }
  bVar4 = false;
LAB_0010c93a:
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return bVar4;
}

Assistant:

inline bool extract(const std::basic_string<CharT> & value, T & dst) {
	CharT c;
	std::basic_istringstream<CharT> is{ value };
	T result;
	if ((is >> std::boolalpha >> result) && !(is >> c)) {
		dst = result;
		return true;
	}
	else {
		return false;
	}
}